

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

void testToLinear(void)

{
  float fVar1;
  unsigned_short v;
  int i;
  long lVar2;
  long lVar3;
  float fVar4;
  float __y;
  char *tmp;
  unsigned_short toLinear [65536];
  
  lVar3 = 2;
  for (lVar2 = 1; lVar2 != 0x10000; lVar2 = lVar2 + 1) {
    if ((~(uint)lVar2 & 0x7c00) == 0) {
      toLinear[lVar2] = 0;
    }
    else {
      fVar4 = *(float *)((long)&half::_toFloat + lVar2 * 4);
      fVar1 = *(float *)(&DAT_001e0188 + (ulong)(fVar4 < 0.0) * 4);
      fVar4 = ABS(fVar4);
      if (fVar4 <= 1.0) {
        __y = 2.2;
      }
      else {
        __y = fVar4 + -1.0;
        fVar4 = 9.025013;
      }
      fVar4 = powf(fVar4,__y);
      half::half((half *)&tmp,fVar4 * fVar1);
      v = (unsigned_short)tmp;
      tmp = (char *)((long)toLinear + lVar3);
      Imf_2_5::Xdr::write<Imf_2_5::CharPtrIO,char*>(&tmp,v);
    }
    lVar3 = lVar3 + 2;
  }
  puts("test dwaCompressorToLinear[]");
  return;
}

Assistant:

void
testToLinear()
{
    unsigned short toLinear[65536];

    toLinear[0] = 0;

    for (int i=1; i<65536; ++i) {
        half  h;
        float sign    = 1;
        float logBase = pow(2.7182818, 2.2);

        // map  NaN and inf to 0
        if ((i & 0x7c00) == 0x7c00) {
            toLinear[i]    = 0;
            continue;
        }

        //
        // _toLinear - assume i is NATIVE, but our output needs
        //             to get flipped to XDR
        //
        h.setBits(i);
        sign = 1;
        if ((float)h < 0) {
            sign = -1;
        } 

        if ( fabs( (float)h) <= 1.0 ) {
            h  = (half)(sign * pow((float)fabs((float)h), 2.2f));
        } else {
            h  = (half)(sign * pow(logBase, (float)(fabs((float)h) - 1.0)));
        }

        {
            char *tmp = (char *)(&toLinear[i]);

            Xdr::write <CharPtrIO> ( tmp,  h.bits());
        }
    }
    
    printf("test dwaCompressorToLinear[]\n");
    for (int i=0; i<65536; ++i)
        assert (toLinear[i] == OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToLinear[i]);
}